

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QList<QTableWidgetSelectionRange> * __thiscall
QTableWidget::selectedRanges
          (QList<QTableWidgetSelectionRange> *__return_storage_ptr__,QTableWidget *this)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_70;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QItemSelectionModel::selection();
  piVar1 = (int *)CONCAT44(local_70.d._4_4_,local_70.d._0_4_);
  local_58.size = local_70.size;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_70);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetSelectionRange *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar5 = (uint)local_58.size;
  QList<QTableWidgetSelectionRange>::reserve(__return_storage_ptr__,(long)(int)uVar5);
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    do {
      uVar2 = QPersistentModelIndex::row();
      uVar3 = QPersistentModelIndex::column();
      uVar4 = QPersistentModelIndex::row();
      local_70.ptr._4_4_ = QPersistentModelIndex::column();
      local_70.d._0_4_ = uVar2;
      local_70.d._4_4_ = uVar3;
      local_70.ptr._0_4_ = uVar4;
      QtPrivate::QMovableArrayOps<QTableWidgetSelectionRange>::emplace<QTableWidgetSelectionRange>
                ((QMovableArrayOps<QTableWidgetSelectionRange> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QTableWidgetSelectionRange *)&local_70);
      QList<QTableWidgetSelectionRange>::end(__return_storage_ptr__);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetSelectionRange> QTableWidget::selectedRanges() const
{
    const QList<QItemSelectionRange> ranges = selectionModel()->selection();
    QList<QTableWidgetSelectionRange> result;
    const int rangesCount = ranges.size();
    result.reserve(rangesCount);
    for (int i = 0; i < rangesCount; ++i)
        result.append({ranges.at(i).top(),
                       ranges.at(i).left(),
                       ranges.at(i).bottom(),
                       ranges.at(i).right()});
    return result;
}